

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O1

void ourWriteOut(OperationConfig *config,per_transfer *per,CURLcode per_result)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  CURLcode CVar7;
  int iVar8;
  void *pvVar9;
  char *pcVar10;
  FILE *pFVar11;
  FILE **ppFVar12;
  char *__s;
  ulong uVar13;
  char *pcVar14;
  FILE *pFVar15;
  bool bVar16;
  FILE *__stream;
  curl_header *header;
  dynbuf name;
  writeoutvar find;
  long local_260;
  dynbuf local_258;
  char *local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  
  __stream = _stdout;
  __s = config->writeout;
  if (__s != (char *)0x0) {
    curlx_dyn_init(&local_258,0x18);
    cVar2 = *__s;
    if (cVar2 == '\0') {
      bVar6 = false;
    }
    else {
      bVar16 = false;
      bVar6 = false;
      do {
        if (cVar2 == '\\') {
          bVar4 = __s[1];
          if (bVar4 < 0x72) {
            if (bVar4 == 0) goto LAB_0011ec93;
            if (bVar4 == 0x6e) {
              iVar8 = 10;
            }
            else {
LAB_0011ecf3:
              iVar8 = 0x5c;
LAB_0011ecf8:
              fputc(iVar8,__stream);
              iVar8 = (int)__s[1];
            }
          }
          else if (bVar4 == 0x72) {
            iVar8 = 0xd;
          }
          else {
            if (bVar4 != 0x74) goto LAB_0011ecf3;
            iVar8 = 9;
          }
LAB_0011ed0b:
          fputc(iVar8,__stream);
          __s = __s + 2;
        }
        else if ((cVar2 == '%') && (cVar3 = __s[1], cVar3 != '\0')) {
          if (cVar3 == '{') {
            local_238 = (char *)0x0;
            uStack_230 = 0;
            local_228 = 0;
            pcVar14 = strchr(__s,0x7d);
            __s = __s + 2;
            if (pcVar14 == (char *)0x0) {
              pcVar14 = "%{";
              goto LAB_0011ef52;
            }
            curlx_dyn_reset(&local_258);
            CVar7 = curlx_dyn_addn(&local_258,__s,(long)pcVar14 - (long)__s);
            if (CVar7 == CURLE_OK) {
              local_238 = curlx_dyn_ptr(&local_258);
              pvVar9 = bsearch(&local_238,variables,0x48,0x18,matchvar);
            }
            else {
              pvVar9 = (void *)0x0;
            }
            if (pvVar9 == (void *)0x0) {
              curl_mfprintf(tool_stderr,"curl: unknown --write-out variable: \'%.*s\'\n",
                            (long)pcVar14 - (long)__s & 0xffffffff,__s);
            }
            else {
              iVar8 = *(int *)((long)pvVar9 + 8);
              if (iVar8 < 0x2f) {
                if (iVar8 == 0xd) {
                  headerJSON((FILE *)__stream,per);
                }
                else if (iVar8 == 0x27) {
                  ourWriteOutJSON((FILE *)__stream,variables,0x48,per,per_result);
                }
                else {
LAB_0011efa9:
                  (**(code **)((long)pvVar9 + 0x10))(__stream,pvVar9,per,per_result,0);
                }
              }
              else {
                if (iVar8 == 0x44) {
                  if (bVar6) {
                    fclose(__stream);
                  }
                  ppFVar12 = (FILE **)&stdout;
                }
                else {
                  if (iVar8 != 0x43) {
                    if (iVar8 != 0x2f) goto LAB_0011efa9;
                    if (per_result == CURLE_OK) {
                      bVar16 = true;
                    }
                    goto LAB_0011efbe;
                  }
                  if (bVar6) {
                    fclose(__stream);
                  }
                  ppFVar12 = &tool_stderr;
                }
                __stream = (FILE *)*ppFVar12;
                bVar6 = false;
              }
            }
LAB_0011efbe:
            __s = pcVar14 + 1;
          }
          else {
            if (cVar3 == '%') {
              iVar8 = 0x25;
              goto LAB_0011ed0b;
            }
            iVar8 = strncmp("header{",__s + 1,7);
            if (iVar8 == 0) {
              __s = __s + 8;
              pcVar14 = strchr(__s,0x7d);
              if (pcVar14 == (char *)0x0) {
                pcVar14 = "%header{";
LAB_0011ef52:
                fputs(pcVar14,__stream);
              }
              else {
                uVar13 = (long)pcVar14 - (long)__s;
                if (uVar13 < 0x100) {
                  memcpy(&local_238,__s,uVar13);
                  *(undefined1 *)((long)&local_238 + uVar13) = 0;
                  iVar8 = curl_easy_header(per->curl,&local_238,0,1,0xffffffff,&local_260);
                  if (iVar8 == 0) {
                    fputs(*(char **)(local_260 + 8),__stream);
                  }
                }
                __s = pcVar14 + 1;
              }
            }
            else {
              iVar8 = strncmp("output{",__s + 1,7);
              if (iVar8 != 0) {
                iVar8 = 0x25;
                goto LAB_0011ecf8;
              }
              if (__s[8] == '>') {
                pcVar10 = __s + 9;
                pcVar14 = "w";
                if (*pcVar10 == '>') {
                  pcVar14 = "a";
                }
                pcVar1 = __s + 10;
                __s = __s + 8;
                if (*pcVar10 == '>') {
                  __s = pcVar1;
                }
              }
              else {
                pcVar14 = "w";
                __s = __s + 8;
              }
              pcVar10 = strchr(__s,0x7d);
              if (pcVar10 == (char *)0x0) {
                pcVar14 = "%output{";
                goto LAB_0011ef52;
              }
              uVar13 = (long)pcVar10 - (long)__s;
              pFVar15 = __stream;
              bVar5 = bVar6;
              if (uVar13 < 0x200) {
                memcpy(&local_238,__s,uVar13);
                *(undefined1 *)((long)&local_238 + uVar13) = 0;
                pFVar11 = fopen64((char *)&local_238,pcVar14);
                if ((pFVar11 != (FILE *)0x0) && (pFVar15 = pFVar11, bVar5 = true, bVar6)) {
                  fclose(__stream);
                }
              }
              __s = pcVar10 + 1;
              __stream = pFVar15;
              bVar6 = bVar5;
            }
          }
        }
        else {
LAB_0011ec93:
          fputc((int)cVar2,__stream);
          __s = __s + 1;
        }
        cVar2 = *__s;
      } while ((cVar2 != '\0') && (!bVar16));
    }
    if (bVar6) {
      fclose(__stream);
    }
    curlx_dyn_free(&local_258);
  }
  return;
}

Assistant:

void ourWriteOut(struct OperationConfig *config, struct per_transfer *per,
                 CURLcode per_result)
{
  FILE *stream = stdout;
  const char *writeinfo = config->writeout;
  const char *ptr = writeinfo;
  bool done = FALSE;
  bool fclose_stream = FALSE;
  struct dynbuf name;

  if(!writeinfo)
    return;

  curlx_dyn_init(&name, MAX_WRITEOUT_NAME_LENGTH);
  while(ptr && *ptr && !done) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        size_t vlen;
        if('{' == ptr[1]) {
          struct writeoutvar *wv = NULL;
          struct writeoutvar find = { 0 };
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          vlen = end - ptr;

          curlx_dyn_reset(&name);
          if(!curlx_dyn_addn(&name, ptr, vlen)) {
            find.name = curlx_dyn_ptr(&name);
            wv = bsearch(&find,
                         variables, CURL_ARRAYSIZE(variables),
                         sizeof(variables[0]), matchvar);
          }
          if(wv) {
            switch(wv->id) {
            case VAR_ONERROR:
              if(per_result == CURLE_OK)
                /* this is not error so skip the rest */
                done = TRUE;
              break;
            case VAR_STDOUT:
              if(fclose_stream)
                fclose(stream);
              fclose_stream = FALSE;
              stream = stdout;
              break;
            case VAR_STDERR:
              if(fclose_stream)
                fclose(stream);
              fclose_stream = FALSE;
              stream = tool_stderr;
              break;
            case VAR_JSON:
              ourWriteOutJSON(stream, variables,
                              CURL_ARRAYSIZE(variables),
                              per, per_result);
              break;
            case VAR_HEADER_JSON:
              headerJSON(stream, per);
              break;
            default:
              (void)wv->writefunc(stream, wv, per, per_result, false);
              break;
            }
          }
          else {
            fprintf(tool_stderr,
                    "curl: unknown --write-out variable: '%.*s'\n",
                    (int)vlen, ptr);
          }
          ptr = end + 1; /* pass the end */
        }
        else if(!strncmp("header{", &ptr[1], 7)) {
          ptr += 8;
          end = strchr(ptr, '}');
          if(end) {
            char hname[256]; /* holds the longest header field name */
            struct curl_header *header;
            vlen = end - ptr;
            if(vlen < sizeof(hname)) {
              memcpy(hname, ptr, vlen);
              hname[vlen] = 0;
              if(CURLHE_OK == curl_easy_header(per->curl, hname, 0,
                                               CURLH_HEADER, -1, &header))
                fputs(header->value, stream);
            }
            ptr = end + 1;
          }
          else
            fputs("%header{", stream);
        }
        else if(!strncmp("output{", &ptr[1], 7)) {
          bool append = FALSE;
          ptr += 8;
          if((ptr[0] == '>') && (ptr[1] == '>')) {
            append = TRUE;
            ptr += 2;
          }
          end = strchr(ptr, '}');
          if(end) {
            char fname[512]; /* holds the longest filename */
            size_t flen = end - ptr;
            if(flen < sizeof(fname)) {
              FILE *stream2;
              memcpy(fname, ptr, flen);
              fname[flen] = 0;
              stream2 = fopen(fname, append ? FOPEN_APPENDTEXT :
                              FOPEN_WRITETEXT);
              if(stream2) {
                /* only change if the open worked */
                if(fclose_stream)
                  fclose(stream);
                stream = stream2;
                fclose_stream = TRUE;
              }
            }
            ptr = end + 1;
          }
          else
            fputs("%output{", stream);
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }
  if(fclose_stream)
    fclose(stream);
  curlx_dyn_free(&name);
}